

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.test_runner.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>_>_>_>
* (anonymous_namespace)::test_case_map__abi_cxx11_(void)

{
  int iVar1;
  
  if (test_case_map_[abi:cxx11]()::value_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&test_case_map_[abi:cxx11]()::value_abi_cxx11_);
    if (iVar1 != 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>_>_>_>
      ::map(&test_case_map_[abi:cxx11]()::value_abi_cxx11_);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_mon::test_case_*,_std::allocator<const_mon::test_case_*>_>_>_>_>
                   ::~map,&test_case_map_[abi:cxx11]()::value_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&test_case_map_[abi:cxx11]()::value_abi_cxx11_);
    }
  }
  return &test_case_map_[abi:cxx11]()::value_abi_cxx11_;
}

Assistant:

map<string, vector<const test_case*>>& test_case_map_()
    {
        static map<string, vector<const test_case*>> value;
        return value;
    }